

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O1

pointer_type
cppcms::impl::mfunc_to_event_handler<cppcms::impl::tcp_pipe,std::shared_ptr<cppcms::impl::tcp_pipe>>
          (offset_in_tcp_pipe_to_subr f,shared_ptr<cppcms::impl::tcp_pipe> *s)

{
  event_handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::tcp_pipe>_>
  *this;
  shared_ptr<cppcms::impl::tcp_pipe> *in_RCX;
  shared_ptr<cppcms::impl::tcp_pipe> *local_30 [2];
  
  local_30[0] = s;
  this = (event_handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::tcp_pipe>_>
          *)operator_new(0x30);
  event_handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::tcp_pipe>_>
  ::event_handler_binder_p0(this,(offset_in_tcp_pipe_to_subr *)local_30,in_RCX);
  *(event_handler_binder_p0<void_(cppcms::impl::tcp_pipe::*)(const_std::error_code_&),_std::shared_ptr<cppcms::impl::tcp_pipe>_>
    **)f = this;
  booster::atomic_counter::inc();
  return (pointer_type)(callable<void_(const_std::error_code_&)> *)f;
}

Assistant:

booster::aio::event_handler::pointer_type mfunc_to_event_handler(void (C::*f)(booster::system::error_code const &e),S s)
{
	return new event_handler_binder_p0<void (C::*)(booster::system::error_code const &),S>(f,s);
}